

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O3

bool __thiscall qpdf::Tokenizer::getToken(Tokenizer *this,Token *token,bool *unread_char,char *ch)

{
  state_e sVar1;
  token_type_e type;
  pointer pcVar2;
  byte bVar3;
  bool bVar4;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  undefined1 local_98 [8];
  _Alloc_hider local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  sVar1 = this->state;
  bVar3 = false;
  if (this->in_token == false) {
    bVar3 = this->before_token ^ 1;
  }
  *unread_char = (bool)bVar3;
  *ch = this->char_to_unread;
  if (sVar1 == st_token_ready) {
    type = this->type;
    bVar4 = (type | tt_array_open) != tt_string;
    if (bVar4) {
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      pcVar2 = (this->raw_val)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,pcVar2,pcVar2 + (this->raw_val)._M_string_length);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      pcVar2 = (this->error_message)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,pcVar2,pcVar2 + (this->error_message)._M_string_length);
      QPDFTokenizer::Token::Token((Token *)local_98,type,&this->raw_val,&local_b8,&local_d8);
    }
    else {
      pcVar2 = (this->raw_val)._M_dataplus._M_p;
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_118,pcVar2,pcVar2 + (this->raw_val)._M_string_length);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      pcVar2 = (this->error_message)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,pcVar2,pcVar2 + (this->error_message)._M_string_length);
      QPDFTokenizer::Token::Token((Token *)local_98,type,&this->val,&local_118,&local_f8);
    }
    token->type = local_98._0_4_;
    std::__cxx11::string::operator=((string *)&token->value,(string *)&local_90);
    std::__cxx11::string::operator=((string *)&token->raw_value,(string *)&local_70);
    std::__cxx11::string::operator=((string *)&token->error_message,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p != &local_60) {
      operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_p != &local_80) {
      operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
    }
    if (!bVar4) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
    }
    if (bVar4) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
    }
    reset(this);
  }
  return sVar1 == st_token_ready;
}

Assistant:

bool
Tokenizer::getToken(Token& token, bool& unread_char, char& ch)
{
    bool ready = (state == st_token_ready);
    unread_char = !in_token && !before_token;
    ch = char_to_unread;
    if (ready) {
        token = (!(type == tt::tt_name || type == tt::tt_string))
            ? Token(type, raw_val, raw_val, error_message)
            : Token(type, val, raw_val, error_message);

        reset();
    }
    return ready;
}